

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

string * __thiscall
tinyusdz::crate::CrateReader::GetWarning_abi_cxx11_
          (string *__return_storage_ptr__,CrateReader *this)

{
  CrateReader *this_local;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_warn);
  return __return_storage_ptr__;
}

Assistant:

std::string CrateReader::GetWarning() { return _warn; }